

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O1

char * get_multiple_arg_token(char *arg)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  size_t sVar7;
  bool bVar8;
  
  if (arg == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar1 = strchr(arg,0x2c);
  if (pcVar1 == (char *)0x0) {
    sVar7 = 0;
  }
  else {
    sVar7 = 0;
    do {
      if (pcVar1[-1] != '\\') {
        sVar2 = (long)pcVar1 - (long)arg;
        goto LAB_0013010a;
      }
      pcVar1 = strchr(pcVar1 + 1,0x2c);
      sVar7 = sVar7 + 1;
    } while (pcVar1 != (char *)0x0);
  }
  sVar2 = strlen(arg);
LAB_0013010a:
  uVar6 = sVar2 - sVar7;
  pcVar1 = (char *)malloc(uVar6 + 1);
  cVar5 = *arg;
  if ((cVar5 != '\0') && (sVar2 != sVar7)) {
    lVar3 = 0;
    uVar4 = 1;
    do {
      if ((cVar5 == '\\') && (arg[lVar3 + 1] == ',')) {
        lVar3 = lVar3 + 1;
      }
      pcVar1[uVar4 - 1] = arg[lVar3];
      cVar5 = arg[lVar3 + 1];
      if (cVar5 == '\0') break;
      lVar3 = lVar3 + 1;
      bVar8 = uVar4 < uVar6;
      uVar4 = uVar4 + 1;
    } while (bVar8);
  }
  pcVar1[uVar6] = '\0';
  return pcVar1;
}

Assistant:

static char *
get_multiple_arg_token(const char *arg)
{
  const char *tok;
  char *ret;
  size_t len, num_of_escape, i, j;

  if (!arg)
    return 0;

  tok = strchr (arg, ',');
  num_of_escape = 0;

  /* make sure it is not escaped */
  while (tok)
    {
      if (*(tok-1) == '\\')
        {
          /* find the next one */
          tok = strchr (tok+1, ',');
          ++num_of_escape;
        }
      else
        break;
    }

  if (tok)
    len = (size_t)(tok - arg + 1);
  else
    len = strlen (arg) + 1;

  len -= num_of_escape;

  ret = (char *) malloc (len);

  i = 0;
  j = 0;
  while (arg[i] && (j < len-1))
    {
      if (arg[i] == '\\' && 
	  arg[ i + 1 ] && 
	  arg[ i + 1 ] == ',')
        ++i;

      ret[j++] = arg[i++];
    }

  ret[len-1] = '\0';

  return ret;
}